

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

long DataSet::random(void)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  int in_ECX;
  ulong in_RDX;
  size_t in_RSI;
  unsigned_long *in_RDI;
  vector<float,_std::allocator<float>_> *c;
  pointer pvVar3;
  float *f;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [64];
  allocator_type local_1412;
  allocator_type local_1411;
  pointer local_1410;
  size_t num_features_local;
  ulong local_1400;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  aimed_centroids;
  vector<float,_std::allocator<float>_> vector;
  NormalRandomGenerator<float> rg;
  undefined1 extraout_var [60];
  
  local_1400 = in_RDX;
  if (in_ECX == -1) {
    UniformRandomGenerator<float>::UniformRandomGenerator((UniformRandomGenerator<float> *)&rg,1);
    std::make_shared<DataSet,unsigned_long&>(in_RDI);
    for (uVar6 = 0; uVar6 != local_1400; uVar6 = uVar6 + 1) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&aimed_centroids,*(size_type *)*in_RDI,
                 (allocator_type *)&vector);
      for (uVar5 = 0; uVar5 < ((DataSet *)*in_RDI)->num_features; uVar5 = uVar5 + 1) {
        fVar7 = UniformRandomGenerator<float>::next((UniformRandomGenerator<float> *)&rg);
        *(float *)((long)&((aimed_centroids.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar5 * 4) = fVar7;
      }
      addVector((DataSet *)*in_RDI,(vector<float,_std::allocator<float>_> *)&aimed_centroids);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&aimed_centroids);
    }
  }
  else {
    num_features_local = in_RSI;
    NormalRandomGenerator<float>::NormalRandomGenerator(&rg,1);
    std::vector<float,_std::allocator<float>_>::vector(&vector,num_features_local,&local_1412);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector(&aimed_centroids,(long)in_ECX,&vector,&local_1411);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&vector.super__Vector_base<float,_std::allocator<float>_>);
    local_1410 = aimed_centroids.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = aimed_centroids.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar3 != local_1410;
        pvVar3 = pvVar3 + 1) {
      pfVar1 = (pvVar3->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar4 = (pvVar3->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start; pfVar4 != pfVar1; pfVar4 = pfVar4 + 1) {
        fVar7 = NormalRandomGenerator<float>::next(&rg);
        *pfVar4 = fVar7;
      }
    }
    std::make_shared<DataSet,unsigned_long&>(in_RDI);
    for (uVar6 = 0; uVar6 != local_1400; uVar6 = uVar6 + 1) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 &vector.super__Vector_base<float,_std::allocator<float>_>,*(size_type *)*in_RDI,
                 &local_1412);
      for (uVar5 = 0; uVar5 < ((DataSet *)*in_RDI)->num_features; uVar5 = uVar5 + 1) {
        local_1410 = (pointer)CONCAT44(local_1410._4_4_,
                                       aimed_centroids.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [(long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 |
                                              uVar6 & 0xffffffff) % (long)in_ECX & 0xffffffff].
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar5]);
        auVar8._0_4_ = NormalRandomGenerator<float>::next(&rg);
        auVar8._4_60_ = extraout_var;
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)local_1410),auVar8._0_16_,ZEXT416(0x3e800000));
        vector.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = auVar2._0_4_;
      }
      addVector((DataSet *)*in_RDI,
                (vector<float,_std::allocator<float>_> *)
                &vector.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&vector.super__Vector_base<float,_std::allocator<float>_>);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&aimed_centroids);
  }
  return (long)in_RDI;
}

Assistant:

std::shared_ptr<DataSet> DataSet::random(size_t num_features, size_t num_vectors, int num_clusters) {

  // Fully randomize feature vectors if number of centroids is negative.
  if (num_clusters == -1) {

    UniformRandomGenerator<float> rg(1);

    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  } else {
    NormalRandomGenerator<float> rg(1);
    // Sort of randomize the data to lie around some centroids
    std::vector<std::vector<float>> aimed_centroids(
        static_cast<unsigned long>(num_clusters),
        std::vector<float>(num_features));

    // Generate some random centroids
    for (auto &c : aimed_centroids) {
      for (auto &f: c) {
        f = rg.next();
      }
    }

    // Create a new data set
    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = aimed_centroids[i % num_clusters][f] + 0.25f * rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  }
}